

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

void __thiscall
soplex::SoPlexBase<double>::changeBoundsReal
          (SoPlexBase<double> *this,VectorBase<double> *lower,VectorBase<double> *upper)

{
  int iVar1;
  int iVar2;
  RangeType *pRVar3;
  SoPlexBase<double> *in_RDI;
  int i;
  double *in_stack_ffffffffffffff88;
  int n;
  RangeType in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  SPxLPRational *vec;
  undefined4 in_stack_ffffffffffffffac;
  undefined1 local_48 [8];
  VectorBase<double> *in_stack_ffffffffffffffc0;
  VectorBase<double> *in_stack_ffffffffffffffc8;
  SoPlexBase<double> *in_stack_ffffffffffffffd0;
  
  _changeBoundsReal(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  iVar1 = intParam(in_RDI,SYNCMODE);
  if (iVar1 == 1) {
    vec = in_RDI->_rationalLP;
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::VectorBase<double>
              ((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)in_RDI,(VectorBase<double> *)vec);
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::VectorBase<double>
              ((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)in_RDI,(VectorBase<double> *)vec);
    (*(code *)((_Vector_impl_data *)
              &(vec->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
               .
               super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
               ._vptr_ClassArray)->_M_start[0x2f])(vec,&stack0xffffffffffffffd0,local_48,0);
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   *)0x1d92de);
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   *)0x1d92e8);
    in_stack_ffffffffffffff94 = 0;
    while( true ) {
      n = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
      iVar1 = in_stack_ffffffffffffff94;
      iVar2 = numColsRational((SoPlexBase<double> *)0x1d9302);
      if (iVar2 <= in_stack_ffffffffffffff94) break;
      in_stack_ffffffffffffff88 =
           VectorBase<double>::operator[]
                     ((VectorBase<double> *)
                      CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),n);
      VectorBase<double>::operator[]
                ((VectorBase<double> *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                 ,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
      in_stack_ffffffffffffff90 =
           _rangeTypeReal((SoPlexBase<double> *)CONCAT44(in_stack_ffffffffffffffac,iVar1),
                          (double *)in_RDI,(double *)vec);
      pRVar3 = DataArray<soplex::SoPlexBase<double>::RangeType>::operator[]
                         (&in_RDI->_colTypes,iVar1);
      *pRVar3 = in_stack_ffffffffffffff90;
      in_stack_ffffffffffffff94 = iVar1 + 1;
    }
  }
  _invalidateSolution((SoPlexBase<double> *)
                      CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  return;
}

Assistant:

void SoPlexBase<R>::changeBoundsReal(const VectorBase<R>& lower, const VectorBase<R>& upper)
{
   assert(_realLP != nullptr);

   _changeBoundsReal(lower, upper);

   if(intParam(SoPlexBase<R>::SYNCMODE) == SYNCMODE_AUTO)
   {
      _rationalLP->changeBounds(VectorRational(lower), VectorRational(upper));

      for(int i = 0; i < numColsRational(); i++)
         _colTypes[i] = _rangeTypeReal(lower[i], upper[i]);
   }

   _invalidateSolution();
}